

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  long *plVar1;
  int local_1c;
  
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    local_1c = 4;
  }
  else {
    GetLocationPath(*(Descriptor **)(this + 0x18),output);
    local_1c = 3;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  plVar1 = (long *)(*(long *)(this + 0x10) + 0x58);
  if (*(long *)(this + 0x18) != 0) {
    plVar1 = (long *)(*(long *)(this + 0x18) + 0x38);
  }
  local_1c = (int)(((long)this - *plVar1) / 0x88);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void Descriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}